

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O0

void __thiscall
mapbox::detail::Earcut<unsigned_int>::splitEarcut(Earcut<unsigned_int> *this,Node *start)

{
  bool bVar1;
  Node *start_00;
  Earcut<unsigned_int> *in_RSI;
  Node *in_RDI;
  Earcut<unsigned_int> *unaff_retaddr;
  Node *c;
  Node *b;
  Node *a;
  Node *b_00;
  Earcut<unsigned_int> *this_00;
  int pass;
  
  this_00 = in_RSI;
  do {
    for (b_00 = (*(Node **)&in_RSI->hashing)->next; b_00 != (Node *)in_RSI->vertices;
        b_00 = b_00->next) {
      if ((*(uint *)&(in_RSI->indices).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start != b_00->i) &&
         (bVar1 = isValidDiagonal(this_00,(Node *)in_RSI,b_00), bVar1)) {
        splitPolygon(unaff_retaddr,in_RDI,(Node *)this_00);
        start_00 = filterPoints(this_00,(Node *)in_RSI,b_00);
        filterPoints(this_00,start_00,b_00);
        pass = (int)((ulong)this_00 >> 0x20);
        earcutLinked(unaff_retaddr,in_RDI,pass);
        earcutLinked(unaff_retaddr,in_RDI,pass);
        return;
      }
    }
    in_RSI = *(Earcut<unsigned_int> **)&in_RSI->hashing;
    if (in_RSI == this_00) {
      return;
    }
  } while( true );
}

Assistant:

void Earcut<N>::splitEarcut(Node* start) {
    // look for a valid diagonal that divides the polygon into two
    Node* a = start;
    do {
        Node* b = a->next->next;
        while (b != a->prev) {
            if (a->i != b->i && isValidDiagonal(a, b)) {
                // split the polygon in two by the diagonal
                Node* c = splitPolygon(a, b);

                // filter colinear points around the cuts
                a = filterPoints(a, a->next);
                c = filterPoints(c, c->next);

                // run earcut on each half
                earcutLinked(a);
                earcutLinked(c);
                return;
            }
            b = b->next;
        }
        a = a->next;
    } while (a != start);
}